

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void errorlimit(FuncState *fs,int limit,char *what)

{
  undefined8 in_RDX;
  uint in_ESI;
  long *in_RDI;
  char *msg;
  int in_stack_00000034;
  char *in_stack_00000038;
  LexState *in_stack_00000040;
  
  if (*(int *)(*in_RDI + 0x60) == 0) {
    luaO_pushfstring((lua_State *)in_RDI[4],"main function has more than %d %s",(ulong)in_ESI,in_RDX
                    );
  }
  else {
    luaO_pushfstring((lua_State *)in_RDI[4],"function at line %d has more than %d %s",
                     (ulong)*(uint *)(*in_RDI + 0x60),(ulong)in_ESI,in_RDX);
  }
  luaX_lexerror(in_stack_00000040,in_stack_00000038,in_stack_00000034);
  return;
}

Assistant:

static void errorlimit(FuncState*fs,int limit,const char*what){
const char*msg=(fs->f->linedefined==0)?
luaO_pushfstring(fs->L,"main function has more than %d %s",limit,what):
luaO_pushfstring(fs->L,"function at line %d has more than %d %s",
fs->f->linedefined,limit,what);
luaX_lexerror(fs->ls,msg,0);
}